

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_chr
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  undefined1 uVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __value;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar1 = (undefined1)*(undefined4 *)&in_RDI[3].container;
  __value = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++(in_RDI,0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&stack0xffffffffffffffe8);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffff0),(value_type *)__value.container);
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }